

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::ItemSimilarityRecommender
          (ItemSimilarityRecommender *this)

{
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__ItemSimilarityRecommender_00771058;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  }
  (this->iteminputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->numrecommendationsinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->itemrestrictioninputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->itemexclusioninputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->recommendeditemlistoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  (this->recommendeditemscoreoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  this->itemstringids_ = (StringVector *)0x0;
  this->itemint64ids_ = (Int64Vector *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

ItemSimilarityRecommender::ItemSimilarityRecommender()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.ItemSimilarityRecommender)
}